

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O0

string * llbuild::basic::escapeForJSON<llvm::StringRef>
                   (string *__return_storage_ptr__,StringRef *in)

{
  char cVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  iterator pcVar4;
  ostream *poVar5;
  char *local_198;
  iterator i;
  ostringstream ss;
  StringRef *in_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  for (local_198 = llvm::StringRef::begin(in); pcVar4 = llvm::StringRef::end(in),
      local_198 != pcVar4; local_198 = local_198 + 1) {
    cVar1 = *local_198;
    if (cVar1 == '\b') {
      std::operator<<((ostream *)&i,"\\b");
    }
    else if (cVar1 == '\t') {
      std::operator<<((ostream *)&i,"\\t");
    }
    else if (cVar1 == '\n') {
      std::operator<<((ostream *)&i,"\\n");
    }
    else if (cVar1 == '\f') {
      std::operator<<((ostream *)&i,"\\f");
    }
    else if (cVar1 == '\r') {
      std::operator<<((ostream *)&i,"\\r");
    }
    else if (cVar1 == '\"') {
      std::operator<<((ostream *)&i,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::operator<<((ostream *)&i,"\\\\");
    }
    else if ((*local_198 < '\0') || ('\x1f' < *local_198)) {
      std::operator<<((ostream *)&i,*local_198);
    }
    else {
      poVar5 = std::operator<<((ostream *)&i,"\\u");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
      _Var3 = std::setw(4);
      poVar5 = std::operator<<(poVar5,_Var3);
      _Var2 = std::setfill<char>('0');
      poVar5 = std::operator<<(poVar5,_Var2._M_c);
      std::ostream::operator<<(poVar5,(int)*local_198);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string escapeForJSON(String const& in) {
    std::ostringstream ss;
    for (auto i = in.begin(); i != in.end(); i++) {
      switch (*i) {
      case '\\': ss << "\\\\"; break;
      case '"': ss << "\\\""; break;
      case '\b': ss << "\\b"; break;
      case '\n': ss << "\\n"; break;
      case '\f': ss << "\\f"; break;
      case '\r': ss << "\\r"; break;
      case '\t': ss << "\\t"; break;
      default:
        if ('\x00' <= *i && *i <= '\x1f') {
          ss << "\\u" << std::hex << std::setw(4) << std::setfill('0')
             << (int)*i;
        } else {
          ss << *i;
        }
      }
    }
    return ss.str();
  }